

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

int __thiscall HModel::load_fromToy(HModel *this,char *filename)

{
  int *m_p;
  int *n_p;
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  int iVar6;
  uint uVar7;
  int c_n;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int el_n;
  int iVar11;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  int r_n_1;
  int iVar15;
  int c_n_1;
  uint uVar16;
  HTimer *this_00;
  double dVar17;
  double *A;
  HTimer *local_60;
  int *intColumn;
  double *ub;
  double *lb;
  double *c;
  double *b;
  
  clearModel(this);
  this->totalTime = 0.0;
  this_00 = &this->timer;
  HTimer::reset(this_00);
  std::__cxx11::string::assign((char *)&this->modelName);
  m_p = &this->numRow;
  n_p = &this->numCol;
  iVar6 = readToy_MIP_cpp(filename,m_p,n_p,&this->objSense,&this->objOffset,&A,&b,&c,&lb,&ub,
                          &intColumn);
  if (iVar6 == 0) {
    uVar12 = 0;
    local_60 = this_00;
    printf("Model has %3d rows and %3d cols\n",(ulong)(uint)*m_p,(ulong)(uint)*n_p);
    printf("Model has Objective sense is %d; Objective offset is %g\n",this->objOffset,
           (ulong)(uint)this->objSense);
    uVar7 = *m_p;
    uVar8 = 0;
    if (0 < (int)uVar7) {
      uVar8 = (ulong)uVar7;
    }
    uVar10 = (ulong)(uint)*n_p;
    if (*n_p < 1) {
      uVar10 = uVar12;
    }
    uVar16 = 0;
    pdVar13 = A;
    for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
      for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
        uVar16 = uVar16 + (pdVar13[uVar14] != 0.0);
      }
      pdVar13 = pdVar13 + (int)uVar7;
    }
    iVar11 = 0;
    printf("Model has %d nonzeros\n",(ulong)uVar16);
    std::ostream::flush();
    std::vector<int,_std::allocator<int>_>::resize(&this->Astart,(long)this->numCol + 1);
    std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,(long)(int)uVar16);
    std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,(long)(int)uVar16);
    piVar1 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    *piVar1 = 0;
    for (lVar9 = 0; lVar9 < *n_p; lVar9 = lVar9 + 1) {
      piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (iVar15 = 0; iVar15 < *m_p; iVar15 = iVar15 + 1) {
        dVar17 = A[*m_p * (int)lVar9 + iVar15];
        if ((dVar17 != 0.0) || (NAN(dVar17))) {
          piVar2[iVar11] = iVar15;
          pdVar3[iVar11] = dVar17;
          iVar11 = iVar11 + 1;
        }
      }
      piVar1[lVar9 + 1] = iVar11;
    }
    puts("Model has sparse matrix");
    std::ostream::flush();
    std::vector<double,_std::allocator<double>_>::resize(&this->colCost,(long)this->numCol);
    std::vector<double,_std::allocator<double>_>::resize(&this->colLower,(long)this->numCol);
    std::vector<double,_std::allocator<double>_>::resize(&this->colUpper,(long)this->numCol);
    std::vector<int,_std::allocator<int>_>::resize(&this->integerColumn,(long)this->numCol);
    std::vector<double,_std::allocator<double>_>::resize(&this->rowLower,(long)this->numRow);
    std::vector<double,_std::allocator<double>_>::resize(&this->rowUpper,(long)this->numRow);
    pdVar3 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = (this->integerColumn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar9 = 0; lVar9 < *n_p; lVar9 = lVar9 + 1) {
      pdVar3[lVar9] = c[lVar9];
      pdVar4[lVar9] = lb[lVar9];
      pdVar5[lVar9] = ub[lVar9];
      piVar1[lVar9] = intColumn[lVar9];
    }
    puts("Model has column data");
    std::ostream::flush();
    uVar7 = *m_p;
    pdVar3 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    uVar12 = 0;
    if (0 < (int)uVar7) {
      uVar12 = (ulong)uVar7;
    }
    for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      dVar17 = b[uVar8];
      pdVar3[uVar8] = dVar17;
      pdVar4[uVar8] = dVar17;
    }
    uVar16 = *n_p;
    uVar8 = 0;
    uVar12 = 0;
    if (0 < (int)uVar16) {
      uVar12 = (ulong)uVar16;
    }
    iVar11 = 0;
    for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      iVar11 = (iVar11 + 1) -
               (uint)((this->integerColumn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8] == 0);
    }
    if (iVar11 != 0) {
      printf("MPS file has %d integer variables\n");
      uVar16 = *n_p;
      uVar7 = *m_p;
    }
    this->numTot = uVar7 + uVar16;
    initScale(this);
    initWithLogicalBasis(this);
    this_00 = local_60;
  }
  dVar17 = HTimer::getTime(this_00);
  this->totalTime = dVar17 + this->totalTime;
  return iVar6;
}

Assistant:

int HModel::load_fromToy(const char *filename) {
  //  int m, n, maxmin;
  //double offset;
  double *A, *b, * c, *lb, *ub;
  int *intColumn;
  // Remove any current model
  clearModel();
  
  // Initialise the total runtine for this model
  totalTime = 0;

  // Load the model, timing the process
  timer.reset();
  modelName = filename;

  int RtCd = readToy_MIP_cpp(filename, &numRow, &numCol, &objSense, &objOffset,
			     &A,
			     &b, &c, &lb, &ub,
			     &intColumn);
  if (RtCd) {
    totalTime += timer.getTime();
    return RtCd;
  }
  printf("Model has %3d rows and %3d cols\n", numRow, numCol);
  printf("Model has Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
  int numNz = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A[r_n+c_n*numRow];
      if (r_v != 0) numNz++;
    }
  }
  printf("Model has %d nonzeros\n", numNz);cout<<flush;
  Astart.resize(numCol+1);
  Aindex.resize(numNz);
  Avalue.resize(numNz);
  Astart[0] = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    int el_n = Astart[c_n];
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A[r_n+c_n*numRow];
      if (r_v != 0) {
  	Aindex[el_n] = r_n;
  	Avalue[el_n] = r_v;
  	el_n++;
      }
    }
    Astart[c_n+1] = el_n;
  }
  printf("Model has sparse matrix\n");cout<<flush;
  colCost.resize(numCol);
  colLower.resize(numCol);
  colUpper.resize(numCol);
  integerColumn.resize(numCol);
  rowLower.resize(numRow);
  rowUpper.resize(numRow);

  for (int c_n = 0; c_n<numCol; c_n++) {
    colCost[c_n] = c[c_n];
    colLower[c_n] = lb[c_n];
    colUpper[c_n] = ub[c_n];
    integerColumn[c_n] = intColumn[c_n];
  }
  printf("Model has column data\n");cout<<flush;
  for (int r_n = 0; r_n<numRow; r_n++) {
    rowLower[r_n] = b[r_n];
    rowUpper[r_n] = b[r_n];
  }  
#ifdef JAJH_dev
  int numIntegerColumn = 0;
  for (int c_n=0; c_n<numCol; c_n++) {
    if (integerColumn[c_n]) numIntegerColumn++;
  }
  if (numIntegerColumn) printf("MPS file has %d integer variables\n", numIntegerColumn);
#endif
 
  numTot = numCol + numRow;

#ifdef JAJH_dev
  //Use this next line to check the loading of a model from arrays
  //check_load_fromArrays(); return;
#endif

  // Assign and initialise the scaling factors
  initScale();
  
  // Initialise with a logical basis then allocate and populate (where
  // possible) work* arrays and allocate basis* arrays
  initWithLogicalBasis();

  totalTime += timer.getTime();
  return RtCd;
}